

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cc
# Opt level: O1

int open_socket(char *host)

{
  ushort uVar1;
  int iVar3;
  char *pcVar4;
  hostent *phVar5;
  ssize_t sVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  size_t sVar10;
  vw_exception *pvVar11;
  sockaddr_in far_end;
  char id;
  char __errmsg [256];
  string local_320;
  string local_300;
  string local_2e0;
  sockaddr local_2c0;
  ostream *local_2b0 [2];
  ostream local_2a0;
  char local_128 [256];
  int iVar2;
  
  pcVar4 = index(host,0x3a);
  if (pcVar4 == (char *)0x0) {
    phVar5 = gethostbyname(host);
    uVar1 = 0x67ae;
  }
  else {
    iVar2 = atoi(pcVar4 + 1);
    uVar1 = (ushort)iVar2;
    local_2b0[0] = &local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,host,pcVar4);
    phVar5 = gethostbyname((char *)local_2b0[0]);
    if (local_2b0[0] != &local_2a0) {
      operator_delete(local_2b0[0]);
    }
  }
  if (phVar5 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"gethostbyname(",0xe);
    poVar7 = std::operator<<(&local_2a0,host);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
    piVar8 = __errno_location();
    pcVar4 = local_128;
    pcVar9 = strerror_r(*piVar8,pcVar4,0x100);
    if (pcVar9 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"errno = ",8);
      sVar10 = strlen(pcVar4);
    }
    else {
      sVar10 = 0xf;
      pcVar4 = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,pcVar4,sVar10);
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/network.cc"
               ,0x33,&local_2e0);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  iVar2 = socket(2,1,0);
  if (iVar2 == -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"socket",6);
    piVar8 = __errno_location();
    pcVar4 = local_128;
    pcVar9 = strerror_r(*piVar8,pcVar4,0x100);
    if (pcVar9 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"errno = ",8);
      sVar10 = strlen(pcVar4);
    }
    else {
      sVar10 = 0xf;
      pcVar4 = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,pcVar4,sVar10);
    pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar11,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/network.cc"
               ,0x37,&local_300);
    __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_2c0.sa_family = 2;
  local_2c0.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  local_2c0.sa_data._2_4_ = *(undefined4 *)*phVar5->h_addr_list;
  local_2c0.sa_data[6] = '\0';
  local_2c0.sa_data[7] = '\0';
  local_2c0.sa_data[8] = '\0';
  local_2c0.sa_data[9] = '\0';
  local_2c0.sa_data[10] = '\0';
  local_2c0.sa_data[0xb] = '\0';
  local_2c0.sa_data[0xc] = '\0';
  local_2c0.sa_data[0xd] = '\0';
  iVar3 = connect(iVar2,&local_2c0,0x10);
  if (iVar3 != -1) {
    local_2b0[0] = (ostream *)((ulong)local_2b0[0] & 0xffffffffffffff00);
    sVar6 = write(iVar2,local_2b0,1);
    if (sVar6 < 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write failed!",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    return iVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"connect(",8);
  poVar7 = std::operator<<(&local_2a0,host);
  local_128[0] = ':';
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_128,1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  piVar8 = __errno_location();
  pcVar4 = local_128;
  pcVar9 = strerror_r(*piVar8,pcVar4,0x100);
  if (pcVar9 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"errno = ",8);
    sVar10 = strlen(pcVar4);
  }
  else {
    sVar10 = 0xf;
    pcVar4 = "errno = unknown";
  }
  std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,pcVar4,sVar10);
  pvVar11 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar11,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/network.cc"
             ,0x3f,&local_320);
  __cxa_throw(pvVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

int open_socket(const char* host)
{
#ifdef _WIN32
  const char* colon = strchr(host, ':');
#else
  const char* colon = index(host, ':');
#endif
  short unsigned int port = 26542;
  hostent* he;
  if (colon != nullptr)
  {
    port = atoi(colon + 1);
    string hostname(host, colon - host);
    he = gethostbyname(hostname.c_str());
  }
  else
    he = gethostbyname(host);

  if (he == nullptr)
    THROWERRNO("gethostbyname(" << host << ")");

  int sd = (int)socket(PF_INET, SOCK_STREAM, 0);
  if (sd == -1)
    THROWERRNO("socket");

  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = htons(port);
  far_end.sin_addr = *(in_addr*)(he->h_addr);
  memset(&far_end.sin_zero, '\0', 8);
  if (connect(sd, (sockaddr*)&far_end, sizeof(far_end)) == -1)
    THROWERRNO("connect(" << host << ':' << port << ")");

  char id = '\0';
  if (
#ifdef _WIN32
      _write(sd, &id, sizeof(id)) < (int)sizeof(id)
#else
      write(sd, &id, sizeof(id)) < (int)sizeof(id)
#endif
  )
    cerr << "write failed!" << endl;
  return sd;
}